

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_conversion.cpp
# Opt level: O0

void Am_HSV_To_RGB(float h,float s,float v,float *r,float *g,float *b)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float t;
  float q;
  float p;
  float frac;
  int region;
  float *b_local;
  float *g_local;
  float *r_local;
  float v_local;
  float s_local;
  float h_local;
  
  v_local = h;
  if ((s != 0.0) || (NAN(s))) {
    for (; 360.0 <= v_local; v_local = v_local - 360.0) {
    }
    iVar1 = (int)(v_local / 60.0);
    fVar2 = v_local / 60.0 - (float)iVar1;
    fVar3 = v * (1.0 - s);
    fVar4 = v * (1.0 - s * fVar2);
    fVar2 = v * (1.0 - s * (1.0 - fVar2));
    switch(iVar1) {
    case 0:
      *r = v;
      *g = fVar2;
      *b = fVar3;
      break;
    case 1:
      *r = fVar4;
      *g = v;
      *b = fVar3;
      break;
    case 2:
      *r = fVar3;
      *g = v;
      *b = fVar2;
      break;
    case 3:
      *r = fVar3;
      *g = fVar4;
      *b = v;
      break;
    case 4:
      *r = fVar2;
      *g = fVar3;
      *b = v;
      break;
    case 5:
      *r = v;
      *g = fVar3;
      *b = fVar4;
    }
  }
  else {
    *r = v;
    *g = v;
    *b = v;
  }
  return;
}

Assistant:

void
Am_HSV_To_RGB(float h, float s, float v, float &r, float &g, float &b)
{
  if (s == 0.0) {
    r = v;
    g = v;
    b = v;
  } else {
    while (h >= 360.0)
      h -= 360.0;
    h = h / 60.0f;
    int region = (int)h;
    float frac = h - (float)region;
    float p = v * (1 - s);
    float q = v * (1 - (s * frac));
    float t = v * (1 - (s * (1 - frac)));
    switch (region) {
    case 0:
      r = v;
      g = t;
      b = p;
      break;
    case 1:
      r = q;
      g = v;
      b = p;
      break;
    case 2:
      r = p;
      g = v;
      b = t;
      break;
    case 3:
      r = p;
      g = q;
      b = v;
      break;
    case 4:
      r = t;
      g = p;
      b = v;
      break;
    case 5:
      r = v;
      g = p;
      b = q;
      break;
    }
  }
}